

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void vli_nativeToBytes(uint8_t *bytes,uint64_t *native)

{
  uint8_t *puVar1;
  uint8_t *digit;
  uint i;
  uint64_t *native_local;
  uint8_t *bytes_local;
  
  for (digit._4_4_ = 0; digit._4_4_ < 4; digit._4_4_ = digit._4_4_ + 1) {
    puVar1 = bytes + (3 - digit._4_4_) * 8;
    *puVar1 = (uint8_t)(native[digit._4_4_] >> 0x38);
    puVar1[1] = (uint8_t)(native[digit._4_4_] >> 0x30);
    puVar1[2] = (uint8_t)(native[digit._4_4_] >> 0x28);
    puVar1[3] = (uint8_t)(native[digit._4_4_] >> 0x20);
    puVar1[4] = (uint8_t)(native[digit._4_4_] >> 0x18);
    puVar1[5] = (uint8_t)(native[digit._4_4_] >> 0x10);
    puVar1[6] = (uint8_t)(native[digit._4_4_] >> 8);
    puVar1[7] = (uint8_t)native[digit._4_4_];
  }
  return;
}

Assistant:

static void vli_nativeToBytes(uint8_t *bytes, const uint64_t *native) {
    unsigned i;
    for (i = 0; i < uECC_WORDS; ++i) {
        uint8_t *digit = bytes + 8 * (uECC_WORDS - 1 - i);
        digit[0] = native[i] >> 56;
        digit[1] = native[i] >> 48;
        digit[2] = native[i] >> 40;
        digit[3] = native[i] >> 32;
        digit[4] = native[i] >> 24;
        digit[5] = native[i] >> 16;
        digit[6] = native[i] >> 8;
        digit[7] = native[i];
    }
}